

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ts_parser__accept(TSParser *self,StackVersion version,Subtree lookahead)

{
  Subtree self_00;
  _Bool _Var1;
  TSSymbol symbol;
  uint32_t new_count;
  MutableSubtree self_01;
  StackSliceArray SVar2;
  uint local_68;
  uint32_t k;
  uint32_t child_count;
  Subtree child;
  Subtree SStack_50;
  uint32_t j;
  Subtree root;
  SubtreeArray trees;
  StackSlice *pSStack_30;
  uint32_t i;
  StackSliceArray pop;
  StackVersion version_local;
  TSParser *self_local;
  Subtree lookahead_local;
  
  _Var1 = ts_subtree_is_eof(lookahead);
  if (!_Var1) {
    __assert_fail("ts_subtree_is_eof(lookahead)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                  ,0x2fd,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
  }
  ts_stack_push(self->stack,version,lookahead,false,1);
  SVar2 = ts_stack_pop_all(self->stack,version);
  trees.capacity = 0;
  do {
    pop.contents._0_4_ = SVar2.size;
    pSStack_30 = SVar2.contents;
    if ((uint)pop.contents <= trees.capacity) {
      ts_stack_remove_version(self->stack,pSStack_30->version);
      ts_stack_halt(self->stack,version);
      return;
    }
    root = *(Subtree *)(pSStack_30 + trees.capacity);
    trees.contents = (Subtree *)((Subtree *)(pSStack_30 + trees.capacity))[1].ptr;
    memset(&stack0xffffffffffffffb0,0,8);
    child._4_4_ = (int)trees.contents;
    do {
      child._4_4_ = child._4_4_ + -1;
      if (child._4_4_ == -1) goto LAB_0013a9b7;
      self_00 = *(Subtree *)(&(root.ptr)->ref_count + (ulong)(uint)child._4_4_ * 2);
      _Var1 = ts_subtree_extra(self_00);
    } while (_Var1);
    if (((ulong)self_00.ptr & 1) != 0) {
      __assert_fail("!child.data.is_inline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                    ,0x308,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
    }
    new_count = ts_subtree_child_count(self_00);
    for (local_68 = 0; local_68 < new_count; local_68 = local_68 + 1) {
      ts_subtree_retain(((self_00.ptr)->field_17).field_0.children[local_68]);
    }
    array__splice((VoidArray *)&root.data,8,child._4_4_,1,new_count,
                  ((self_00.ptr)->field_17).field_0.children);
    symbol = ts_subtree_symbol(self_00);
    self_01 = ts_subtree_new_node(&self->tree_pool,symbol,(SubtreeArray *)&root.data,
                                  (uint)((self_00.ptr)->field_17).field_0.alias_sequence_id,
                                  self->language);
    SStack_50 = ts_subtree_from_mut(self_01);
    ts_subtree_release(&self->tree_pool,self_00);
LAB_0013a9b7:
    if (SStack_50.ptr == (SubtreeHeapData *)0x0) {
      __assert_fail("root.ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                    ,0x31a,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
    }
    self->accept_count = self->accept_count + 1;
    if ((self->finished_tree).ptr == (SubtreeHeapData *)0x0) {
      self->finished_tree = SStack_50;
    }
    else {
      _Var1 = ts_parser__select_tree(self,self->finished_tree,SStack_50);
      if (_Var1) {
        ts_subtree_release(&self->tree_pool,self->finished_tree);
        self->finished_tree = SStack_50;
      }
      else {
        ts_subtree_release(&self->tree_pool,SStack_50);
      }
    }
    trees.capacity = trees.capacity + 1;
  } while( true );
}

Assistant:

static void ts_parser__accept(TSParser *self, StackVersion version, Subtree lookahead) {
  assert(ts_subtree_is_eof(lookahead));
  ts_stack_push(self->stack, version, lookahead, false, 1);

  StackSliceArray pop = ts_stack_pop_all(self->stack, version);
  for (uint32_t i = 0; i < pop.size; i++) {
    SubtreeArray trees = pop.contents[i].subtrees;

    Subtree root = NULL_SUBTREE;
    for (uint32_t j = trees.size - 1; j + 1 > 0; j--) {
      Subtree child = trees.contents[j];
      if (!ts_subtree_extra(child)) {
        assert(!child.data.is_inline);
        uint32_t child_count = ts_subtree_child_count(child);
        for (uint32_t k = 0; k < child_count; k++) {
          ts_subtree_retain(child.ptr->children[k]);
        }
        array_splice(&trees, j, 1, child_count, child.ptr->children);
        root = ts_subtree_from_mut(ts_subtree_new_node(
          &self->tree_pool,
          ts_subtree_symbol(child),
          &trees,
          child.ptr->alias_sequence_id,
          self->language
        ));
        ts_subtree_release(&self->tree_pool, child);
        break;
      }
    }

    assert(root.ptr);
    self->accept_count++;

    if (self->finished_tree.ptr) {
      if (ts_parser__select_tree(self, self->finished_tree, root)) {
        ts_subtree_release(&self->tree_pool, self->finished_tree);
        self->finished_tree = root;
      } else {
        ts_subtree_release(&self->tree_pool, root);
      }
    } else {
      self->finished_tree = root;
    }
  }

  ts_stack_remove_version(self->stack, pop.contents[0].version);
  ts_stack_halt(self->stack, version);
}